

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::resetOnNewSessionFixture::resetOnNewSessionFixture
          (resetOnNewSessionFixture *this)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  sessionFixture *psVar4;
  sessionFixture *psVar5;
  undefined4 uVar6;
  ulong uVar7;
  DateTime d;
  long local_18;
  
  sessionFixture::sessionFixture((sessionFixture *)this,0);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_00328280;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application = (_func_int **)&PTR__resetOnNewSessionFixture_003282d8;
  FIX::DateTime::nowUtc();
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_time = local_18;
  piVar1 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
            super_DateTime.m_date;
  psVar4 = &(this->super_acceptorFixture).super_sessionFixture;
  uVar6 = *(undefined4 *)&(psVar4->super_TestCallback).startTime.super_DateTime.field_0xc;
  psVar5 = &(this->super_acceptorFixture).super_sessionFixture;
  (psVar5->super_TestCallback).endTime.super_DateTime.m_date =
       (psVar4->super_TestCallback).startTime.super_DateTime.m_date;
  *(undefined4 *)&(psVar5->super_TestCallback).endTime.super_DateTime.field_0xc = uVar6;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time;
  iVar2 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
          super_DateTime.m_date;
  lVar3 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
          super_DateTime.m_time;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = lVar3 + 2000000000U;
  if (lVar3 < 0x4e941a196c01) {
    if (lVar3 < -2000000000) {
      *piVar1 = iVar2 + -1;
      uVar7 = lVar3 + 0x4e9508849400;
      goto LAB_002a47f4;
    }
  }
  else {
    *piVar1 = iVar2 + 1;
    uVar7 = (lVar3 + 2000000000U) % 86400000000000;
LAB_002a47f4:
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_time = uVar7;
  }
  piVar1 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
            super_DateTime.m_date;
  iVar2 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
          super_DateTime.m_date;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_time = local_18 - 2000000000U;
  if (local_18 < 0x4e9508849401) {
    if (1999999999 < local_18) goto LAB_002a483d;
    *piVar1 = iVar2 + -1;
    uVar7 = local_18 + 0x4e941a196c00;
  }
  else {
    *piVar1 = iVar2 + 1;
    uVar7 = (local_18 - 2000000000U) % 86400000000000;
  }
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_time = uVar7;
LAB_002a483d:
  sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

resetOnNewSessionFixture()
  {
    startTime.setCurrent();
    endTime = startTime;
    endTime += 2;
    startTime += -2;

    acceptorFixture::createSession( 0 );
  }